

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arranger.cpp
# Opt level: O2

void initialize_proxy_list(char **proxies_str_list,int count,download_status *status)

{
  char *__s;
  size_t sVar1;
  ulong uVar2;
  ulong uVar3;
  proxy proxy_to_insert;
  value_type local_60;
  
  uVar2 = 0;
  uVar3 = (ulong)(uint)count;
  if (count < 1) {
    uVar3 = uVar2;
  }
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    __s = proxies_str_list[uVar2];
    sVar1 = strlen(__s);
    local_60.address._M_dataplus._M_p = (pointer)&local_60.address.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,__s,__s + sVar1);
    local_60.index = (int)uVar2;
    local_60.speed = -1;
    std::__cxx11::list<proxy,_std::allocator<proxy>_>::insert
              (&status->globalProxyList,(const_iterator)&status->globalProxyList,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
  }
  return;
}

Assistant:

void initialize_proxy_list(char **proxies_str_list, int count, download_status *status) {
    for (int i = 0; i < count; i++) {
        proxy proxy_to_insert = {string(proxies_str_list[i],strlen(proxies_str_list[i])), i};
        status->globalProxyList.insert(status->globalProxyList.end(), proxy_to_insert);
    }
}